

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Serializer.cpp
# Opt level: O2

TimestepInfo * __thiscall
adios2::format::BP5Serializer::CloseTimestep
          (TimestepInfo *__return_storage_ptr__,BP5Serializer *this,int timestep,
          bool forceCopyDeferred)

{
  FMFieldList p_Var1;
  pointer pp_Var2;
  _FMFormatBody *p_Var3;
  pointer pcVar4;
  TimestepInfo *pTVar5;
  BP5Serializer *this_00;
  int iVar6;
  FMFormat p_Var7;
  FFSBuffer p_Var8;
  undefined4 extraout_var;
  void *pvVar9;
  BufferFFS *this_01;
  BufferFFS *this_02;
  long lVar10;
  pointer pp_Var11;
  undefined8 *puVar12;
  FMStructDescRec *pFVar13;
  byte bVar14;
  allocator local_35c;
  allocator local_35b;
  allocator local_35a;
  allocator local_359;
  size_t AttributeSize;
  MetaMetaInfoBlock Block;
  vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  Formats;
  size_t MetaDataSize;
  int size;
  TimestepInfo *local_2e8;
  BP5Serializer *local_2e0;
  string local_2d8;
  FMStructDescRec struct_list [4];
  undefined1 local_c0 [144];
  
  bVar14 = 0;
  Formats.
  super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Formats.
  super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  Formats.
  super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (((this->Info).MetaFormat == (FMFormat)0x0) && ((this->Info).MetaFieldCount != 0)) {
    struct_list[0].opt_info = (FMOptInfo *)0x0;
    struct_list[0].format_name = (char *)0x0;
    struct_list[0].field_list = (FMFieldList)0x0;
    struct_list[0]._16_8_ = struct_list[0]._16_8_ & 0xffffffff00000000;
    struct_list[1].format_name = "complex4";
    struct_list[1].field_list = (FMFieldList)fcomplex_field_list;
    struct_list[1].struct_size = 8;
    struct_list[1].opt_info = (FMOptInfo *)0x0;
    struct_list[2].format_name = "complex8";
    struct_list[2].field_list = (FMFieldList)dcomplex_field_list;
    struct_list[2].struct_size = 0x10;
    struct_list[2].opt_info = (FMOptInfo *)0x0;
    struct_list[3].format_name = "MetaArray";
    struct_list[3].field_list =
         *(FMFieldList *)(&this->field_0x240 + (long)this->_vptr_BP5Serializer[-3]);
    struct_list[3].struct_size = 0x38;
    struct_list[3].opt_info = (FMOptInfo *)0x0;
    memset(local_c0,0,0x88);
    struct_list[0].format_name = "MetaData";
    struct_list[0].field_list = (this->Info).MetaFields;
    iVar6 = FMstruct_size_field_list(struct_list[0].field_list,8);
    struct_list[0].struct_size = iVar6;
    p_Var7 = (FMFormat)register_data_format((this->Info).LocalFMContext);
    (this->Info).MetaFormat = p_Var7;
    Block.MetaMetaInfo = (char *)get_server_rep_FMformat(p_Var7,&size);
    Block.MetaMetaInfoLen = (size_t)size;
    Block.MetaMetaID = (char *)get_server_ID_FMformat(p_Var7);
    Block.MetaMetaIDLen = (size_t)size;
    std::
    vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
    ::push_back(&Formats,&Block);
  }
  if ((this->NewAttribute == true) &&
     (p_Var1 = (this->Info).AttributeFields, p_Var1 != (FMFieldList)0x0)) {
    puVar12 = &DAT_00822e80;
    pFVar13 = struct_list;
    for (lVar10 = 0x10; lVar10 != 0; lVar10 = lVar10 + -1) {
      pFVar13->format_name = (char *)*puVar12;
      puVar12 = puVar12 + (ulong)bVar14 * -2 + 1;
      pFVar13 = (FMStructDescRec *)((long)pFVar13 + (ulong)bVar14 * -0x10 + 8);
    }
    struct_list[0].format_name = "Attributes";
    struct_list[0].field_list = p_Var1;
    iVar6 = FMstruct_size_field_list(p_Var1,8);
    struct_list[0].struct_size = iVar6;
    p_Var7 = (FMFormat)register_data_format((this->Info).LocalFMContext);
    (this->Info).AttributeFormat = p_Var7;
    Block.MetaMetaInfo = (char *)get_server_rep_FMformat(p_Var7,&size);
    Block.MetaMetaInfoLen = (size_t)size;
    Block.MetaMetaID = (char *)get_server_ID_FMformat(p_Var7);
    Block.MetaMetaIDLen = (size_t)size;
    std::
    vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
    ::push_back(&Formats,&Block);
  }
  pp_Var2 = (this->NewStructFormats).
            super__Vector_base<_FMFormatBody_*,_std::allocator<_FMFormatBody_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  local_2e8 = __return_storage_ptr__;
  local_2e0 = this;
  for (pp_Var11 = (this->NewStructFormats).
                  super__Vector_base<_FMFormatBody_*,_std::allocator<_FMFormatBody_*>_>._M_impl.
                  super__Vector_impl_data._M_start; this_00 = local_2e0, pp_Var11 != pp_Var2;
      pp_Var11 = pp_Var11 + 1) {
    p_Var3 = *pp_Var11;
    struct_list[0].format_name = (char *)get_server_rep_FMformat(p_Var3,&Block);
    struct_list[0].field_list = (FMFieldList)(long)(int)Block.MetaMetaInfo;
    struct_list[0]._16_8_ = get_server_ID_FMformat(p_Var3,&Block);
    struct_list[0].opt_info = (FMOptInfo *)(long)(int)Block.MetaMetaInfo;
    std::
    vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
    ::push_back(&Formats,(value_type *)struct_list);
  }
  pp_Var11 = (local_2e0->NewStructFormats).
             super__Vector_base<_FMFormatBody_*,_std::allocator<_FMFormatBody_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((local_2e0->NewStructFormats).
      super__Vector_base<_FMFormatBody_*,_std::allocator<_FMFormatBody_*>_>._M_impl.
      super__Vector_impl_data._M_finish != pp_Var11) {
    (local_2e0->NewStructFormats).
    super__Vector_base<_FMFormatBody_*,_std::allocator<_FMFormatBody_*>_>._M_impl.
    super__Vector_impl_data._M_finish = pp_Var11;
  }
  p_Var8 = (FFSBuffer)create_FFSBuffer();
  MetaDataSize = 0;
  AttributeSize = 0;
  pvVar9 = this_00->MetadataBuf;
  if (this_00->CurDataBuffer == (BufferV *)0x0) {
    std::__cxx11::string::string((string *)struct_list,"Toolkit",&local_359);
    std::__cxx11::string::string((string *)&Block,"format::BP5Serializer",&local_35a);
    std::__cxx11::string::string((string *)&size,"CloseTimestep",&local_35b);
    std::__cxx11::string::string((string *)&local_2d8,"without prior Init",&local_35c);
    helper::Throw<std::logic_error>
              ((string *)struct_list,(string *)&Block,(string *)&size,&local_2d8,-1);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::__cxx11::string::~string((string *)&size);
    std::__cxx11::string::~string((string *)&Block);
    std::__cxx11::string::~string((string *)struct_list);
  }
  DumpDeferredBlocks(this_00,forceCopyDeferred);
  iVar6 = (*this_00->CurDataBuffer->_vptr_BufferV[4])
                    (this_00->CurDataBuffer,0,0,this_00->m_BufferBlockSize,1,1);
  *(size_t *)((long)pvVar9 + 0x10) =
       CONCAT44(extraout_var,iVar6) + this_00->m_PriorDataBufferSizeTotal;
  ProcessDeferredMinMax(this_00);
  CollectFinalShapeValues(this_00);
  pvVar9 = (void *)FFSencode(p_Var8,(this_00->Info).MetaFormat,this_00->MetadataBuf,&MetaDataSize);
  this_01 = (BufferFFS *)operator_new(0x50);
  BufferFFS::BufferFFS(this_01,p_Var8,pvVar9,MetaDataSize);
  if (this_00->PendingAttrs == (BP5AttrStruct *)0x0) {
    this_02 = (BufferFFS *)0x0;
    if ((this_00->NewAttribute == true) && ((this_00->Info).AttributeFields != (FMFieldList)0x0)) {
      p_Var8 = (FFSBuffer)create_FFSBuffer();
      pvVar9 = (void *)FFSencode(p_Var8,(this_00->Info).AttributeFormat,
                                 (this_00->Info).AttributeData,&AttributeSize);
      this_02 = (BufferFFS *)operator_new(0x50);
      BufferFFS::BufferFFS(this_02,p_Var8,pvVar9,AttributeSize);
    }
  }
  else {
    if (this_00->GenericAttributeFormat == (FMFormat)0x0) {
      p_Var7 = (FMFormat)
               register_data_format
                         ((this_00->Info).LocalFMContext,
                          &this_00->field_0x1c0 + (long)this_00->_vptr_BP5Serializer[-3]);
      this_00->GenericAttributeFormat = p_Var7;
      (this_00->Info).AttributeFormat = p_Var7;
      struct_list[0].format_name = (char *)get_server_rep_FMformat(p_Var7,&Block);
      struct_list[0].field_list = (FMFieldList)(long)(int)Block.MetaMetaInfo;
      struct_list[0]._16_8_ = get_server_ID_FMformat(this_00->GenericAttributeFormat);
      struct_list[0].opt_info = (FMOptInfo *)(long)(int)Block.MetaMetaInfo;
      std::
      vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
      ::push_back(&Formats,(value_type *)struct_list);
    }
    p_Var8 = (FFSBuffer)create_FFSBuffer();
    pvVar9 = (void *)FFSencode(p_Var8,this_00->GenericAttributeFormat,this_00->PendingAttrs,
                               &AttributeSize);
    this_02 = (BufferFFS *)operator_new(0x50);
    BufferFFS::BufferFFS(this_02,p_Var8,pvVar9,AttributeSize);
    FMfree_var_rec_elements(this_00->GenericAttributeFormat);
    operator_delete(this_00->PendingAttrs);
    this_00->PendingAttrs = (BP5AttrStruct *)0x0;
  }
  pcVar4 = (this_01->super_Buffer).m_Type._M_dataplus._M_p;
  (this_01->super_Buffer).m_Type._M_dataplus._M_p = (pointer)0x0;
  if ((this_00->Info).MetaFormat != (FMFormat)0x0) {
    FMfree_var_rec_elements();
  }
  if ((this_00->MetadataBuf != (void *)0x0) && (this_00->MetadataSize != 0)) {
    memset(this_00->MetadataBuf,0,this_00->MetadataSize);
  }
  pTVar5 = local_2e8;
  (this_01->super_Buffer).m_Type._M_dataplus._M_p = pcVar4;
  this_00->NewAttribute = false;
  (local_2e8->MetaEncodeBuffer).
  super___shared_ptr<adios2::format::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (local_2e8->AttributeEncodeBuffer).
  super___shared_ptr<adios2::format::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (local_2e8->NewMetaMetaBlocks).
  super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_2e8->MetaEncodeBuffer).
  super___shared_ptr<adios2::format::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (local_2e8->NewMetaMetaBlocks).
  super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_2e8->NewMetaMetaBlocks).
  super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_2e8->AttributeEncodeBuffer).
  super___shared_ptr<adios2::format::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::
  vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  ::operator=(&local_2e8->NewMetaMetaBlocks,&Formats);
  std::__shared_ptr<adios2::format::Buffer,_(__gnu_cxx::_Lock_policy)2>::
  reset<adios2::format::BufferFFS>
            (&(pTVar5->MetaEncodeBuffer).
              super___shared_ptr<adios2::format::Buffer,_(__gnu_cxx::_Lock_policy)2>,this_01);
  std::__shared_ptr<adios2::format::Buffer,_(__gnu_cxx::_Lock_policy)2>::
  reset<adios2::format::BufferFFS>
            (&(pTVar5->AttributeEncodeBuffer).
              super___shared_ptr<adios2::format::Buffer,_(__gnu_cxx::_Lock_policy)2>,this_02);
  pTVar5->DataBuffer = this_00->CurDataBuffer;
  this_00->CurDataBuffer = (BufferV *)0x0;
  if ((this_00->Info).AttributeFields != (FMFieldList)0x0) {
    free_FMfield_list();
    (this_00->Info).AttributeFields = (FMFieldList)0x0;
  }
  (this_00->Info).AttributeFieldCount = 0;
  pvVar9 = (this_00->Info).AttributeData;
  if (pvVar9 != (void *)0x0) {
    free(pvVar9);
    (this_00->Info).AttributeData = (void *)0x0;
  }
  (this_00->Info).AttributeSize = 0;
  std::
  _Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  ::~_Vector_base(&Formats.
                   super__Vector_base<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
                 );
  return pTVar5;
}

Assistant:

BP5Serializer::TimestepInfo BP5Serializer::CloseTimestep(int timestep, bool forceCopyDeferred)
{
    // EndStep()
    std::vector<MetaMetaInfoBlock> Formats;
    if (!Info.MetaFormat && Info.MetaFieldCount)
    {
        MetaMetaInfoBlock Block;
        FMStructDescRec struct_list[20] = {
            {NULL, NULL, 0, NULL},
            {"complex4", fcomplex_field_list, sizeof(fcomplex_struct), NULL},
            {"complex8", dcomplex_field_list, sizeof(dcomplex_struct), NULL},
            {"MetaArray", MetaArrayRecListPtr, sizeof(MetaArrayRec), NULL},
            {"MetaArrayOp", MetaArrayRecOperatorListPtr, sizeof(MetaArrayRecOperator), NULL},
            {"MetaArrayMM1", MetaArrayRecMM1ListPtr, sizeof(MetaArrayRecMM), NULL},
            {"MetaArrayOpMM1", MetaArrayRecOperatorMM1ListPtr, sizeof(MetaArrayRecOperatorMM),
             NULL},
            {"MetaArrayMM2", MetaArrayRecMM2ListPtr, sizeof(MetaArrayRecMM), NULL},
            {"MetaArrayOpMM2", MetaArrayRecOperatorMM2ListPtr, sizeof(MetaArrayRecOperatorMM),
             NULL},
            {"MetaArrayMM4", MetaArrayRecMM4ListPtr, sizeof(MetaArrayRecMM), NULL},
            {"MetaArrayOpMM4", MetaArrayRecOperatorMM4ListPtr, sizeof(MetaArrayRecOperatorMM),
             NULL},
            {"MetaArrayMM8", MetaArrayRecMM8ListPtr, sizeof(MetaArrayRecMM), NULL},
            {"MetaArrayOpMM8", MetaArrayRecOperatorMM8ListPtr, sizeof(MetaArrayRecOperatorMM),
             NULL},
            {"MetaArrayMM16", MetaArrayRecMM16ListPtr, sizeof(MetaArrayRecMM), NULL},
            {"MetaArrayOpMM16", MetaArrayRecOperatorMM16ListPtr, sizeof(MetaArrayRecOperatorMM),
             NULL},
            {NULL, NULL, 0, NULL}};
        struct_list[0].format_name = "MetaData";
        struct_list[0].field_list = Info.MetaFields;
        struct_list[0].struct_size = FMstruct_size_field_list(Info.MetaFields, sizeof(char *));

        FMFormat Format = register_data_format(Info.LocalFMContext, &struct_list[0]);

        Info.MetaFormat = Format;
        int size;
        Block.MetaMetaInfo = get_server_rep_FMformat(Format, &size);
        Block.MetaMetaInfoLen = size;
        Block.MetaMetaID = get_server_ID_FMformat(Format, &size);
        Block.MetaMetaIDLen = size;
        Formats.push_back(Block);
    }
    if (NewAttribute && Info.AttributeFields)
    {
        MetaMetaInfoBlock Block;
        FMStructDescRec struct_list[4] = {
            {NULL, NULL, 0, NULL},
            {"complex4", fcomplex_field_list, sizeof(fcomplex_struct), NULL},
            {"complex8", dcomplex_field_list, sizeof(dcomplex_struct), NULL},
            {NULL, NULL, 0, NULL}};
        struct_list[0].format_name = "Attributes";
        struct_list[0].field_list = Info.AttributeFields;
        struct_list[0].struct_size = FMstruct_size_field_list(Info.AttributeFields, sizeof(char *));

        FMFormat Format = register_data_format(Info.LocalFMContext, &struct_list[0]);
        Info.AttributeFormat = Format;
        int size;
        Block.MetaMetaInfo = get_server_rep_FMformat(Format, &size);
        Block.MetaMetaInfoLen = size;
        Block.MetaMetaID = get_server_ID_FMformat(Format, &size);
        Block.MetaMetaIDLen = size;
        Formats.push_back(Block);
    }
    for (auto Format : NewStructFormats)
    {
        MetaMetaInfoBlock Block;
        int size;
        Block.MetaMetaInfo = get_server_rep_FMformat(Format, &size);
        Block.MetaMetaInfoLen = size;
        Block.MetaMetaID = get_server_ID_FMformat(Format, &size);
        Block.MetaMetaIDLen = size;
        Formats.push_back(Block);
    }
    NewStructFormats.clear();

    // Encode Metadata and Data to create contiguous data blocks
    FFSBuffer MetaEncodeBuffer = create_FFSBuffer();
    FFSBuffer AttributeEncodeBuffer = NULL;
    size_t MetaDataSize = 0;
    size_t AttributeSize = 0;
    struct BP5MetadataInfoStruct *MBase = (struct BP5MetadataInfoStruct *)MetadataBuf;

    if (CurDataBuffer == NULL)
    {
        helper::Throw<std::logic_error>("Toolkit", "format::BP5Serializer", "CloseTimestep",
                                        "without prior Init");
    }

    //  Dump data for externs into iovec
    DumpDeferredBlocks(forceCopyDeferred);

    MBase->DataBlockSize =
        CurDataBuffer->AddToVec(0, NULL, m_BufferBlockSize, true); //  output block size aligned

    MBase->DataBlockSize += m_PriorDataBufferSizeTotal;

    ProcessDeferredMinMax();

    CollectFinalShapeValues();

    void *MetaDataBlock = FFSencode(MetaEncodeBuffer, Info.MetaFormat, MetadataBuf, &MetaDataSize);
    BufferFFS *Metadata = new BufferFFS(MetaEncodeBuffer, MetaDataBlock, MetaDataSize);

    BufferFFS *AttrData = NULL;

    if (PendingAttrs)
    {
        if (!GenericAttributeFormat)
        {
            MetaMetaInfoBlock Block;
            GenericAttributeFormat =
                register_data_format(Info.LocalFMContext, &attr_struct_list[0]);
            Info.AttributeFormat = GenericAttributeFormat;
            int size;
            Block.MetaMetaInfo = get_server_rep_FMformat(GenericAttributeFormat, &size);
            Block.MetaMetaInfoLen = size;
            Block.MetaMetaID = get_server_ID_FMformat(GenericAttributeFormat, &size);
            Block.MetaMetaIDLen = size;
            Formats.push_back(Block);
        }
        AttributeEncodeBuffer = create_FFSBuffer();
        void *AttributeBlock =
            FFSencode(AttributeEncodeBuffer, GenericAttributeFormat, PendingAttrs, &AttributeSize);
        AttrData = new BufferFFS(AttributeEncodeBuffer, AttributeBlock, AttributeSize);
        //	FMdump_encoded_data(GenericAttributeFormat, AttributeBlock,
        // 1024000);
        FMfree_var_rec_elements(GenericAttributeFormat, PendingAttrs);
        delete (PendingAttrs);
        PendingAttrs = nullptr;
    }
    else
    {
        // old way of doing attributes
        if (NewAttribute && Info.AttributeFields)
        {
            AttributeEncodeBuffer = create_FFSBuffer();
            void *AttributeBlock = FFSencode(AttributeEncodeBuffer, Info.AttributeFormat,
                                             Info.AttributeData, &AttributeSize);
            AttrData = new BufferFFS(AttributeEncodeBuffer, AttributeBlock, AttributeSize);
        }
    }

    // FMdump_encoded_data(Info.MetaFormat, MetaDataBlock, 1024000);
    /* free all those copied dimensions, etc */
    MBase = (struct BP5MetadataInfoStruct *)Metadata;
    size_t *tmp = MBase->BitField;
    /*
     * BitField value is saved away from FMfree_var_rec_elements() so that it
     * isn't unnecessarily free'd.
     */
    MBase->BitField = NULL;
    if (Info.MetaFormat)
        FMfree_var_rec_elements(Info.MetaFormat, MetadataBuf);
    if (MetadataBuf && MetadataSize)
        memset(MetadataBuf, 0, MetadataSize);
    MBase->BitField = tmp;
    NewAttribute = false;

    struct TimestepInfo Ret;
    Ret.NewMetaMetaBlocks = Formats;
    Ret.MetaEncodeBuffer.reset(Metadata);
    Ret.AttributeEncodeBuffer.reset(AttrData);
    Ret.DataBuffer = CurDataBuffer;
    CurDataBuffer = NULL;

    if (Info.AttributeFields)
    {
        free_FMfield_list(Info.AttributeFields);
        Info.AttributeFields = NULL;
    }
    Info.AttributeFieldCount = 0;

    if (Info.AttributeData)
    {
        free(Info.AttributeData);
        Info.AttributeData = NULL;
    }
    Info.AttributeSize = 0;

    return Ret;
}